

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::AssignInst::useVars
          (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           *__return_storage_ptr__,AssignInst *this)

{
  _Rb_tree_header *p_Var1;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *__v;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->src).field_0x18 == '\x01') {
    __v = std::get<1ul,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)&(this->src).field_0x8);
    std::
    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
    ::_M_insert_unique<mir::inst::VarId_const&>
              ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)__return_storage_ptr__,__v);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<VarId> useVars() const {
    auto s = std::set<VarId>();
    if (src.index() == 1) {
      s.insert(std::get<VarId>(src));
    }
    return s;
  }